

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O2

MQTT_MESSAGE_HANDLE mqttmessage_clone(MQTT_MESSAGE_HANDLE handle)

{
  MQTT_MESSAGE_HANDLE pMVar1;
  LOGGER_LOG p_Var2;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_clone",0xa0,1,"Invalid Parameter handle: %p.",0);
      return (MQTT_MESSAGE_HANDLE)0x0;
    }
  }
  else {
    pMVar1 = mqttmessage_create(handle->packetId,handle->topicName,handle->qosInfo,
                                (handle->appPayload).message,(handle->appPayload).length);
    if (pMVar1 != (MQTT_MESSAGE_HANDLE)0x0) {
      pMVar1->isDuplicateMsg = handle->isDuplicateMsg;
      pMVar1->isMessageRetained = handle->isMessageRetained;
      return pMVar1;
    }
  }
  return (MQTT_MESSAGE_HANDLE)0x0;
}

Assistant:

MQTT_MESSAGE_HANDLE mqttmessage_clone(MQTT_MESSAGE_HANDLE handle)
{
    MQTT_MESSAGE_HANDLE result;
    if (handle == NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_007: [If handle parameter is NULL then mqttmessage_clone shall return NULL.] */
        LogError("Invalid Parameter handle: %p.", handle);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_008: [mqttmessage_clone shall create a new MQTT_MESSAGE_HANDLE with data content identical of the handle value.] */
        result = mqttmessage_create(handle->packetId, handle->topicName, handle->qosInfo, handle->appPayload.message, handle->appPayload.length);
        if (result != NULL)
        {
            result->isDuplicateMsg = handle->isDuplicateMsg;
            result->isMessageRetained = handle->isMessageRetained;
        }
    }
    return result;
}